

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall despot::log_ostream::log_ostream(log_ostream *this,ostream *out,string *marker)

{
  string *out_00;
  string local_50;
  string *local_20;
  string *marker_local;
  ostream *out_local;
  log_ostream *this_local;
  
  local_20 = marker;
  marker_local = (string *)out;
  out_local = &this->super_ostream;
  std::ios::ios((ios *)&(this->super_ostream).field_0x98);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x26f288;
  *(undefined8 *)&(this->super_ostream).field_0x98 = 0x26f2b0;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__0026f2c8);
  out_00 = marker_local;
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x26f288;
  *(undefined8 *)&(this->super_ostream).field_0x98 = 0x26f2b0;
  std::__cxx11::string::string((string *)&local_50,(string *)marker);
  log_buf::log_buf((log_buf *)&(this->super_ostream).field_0x8,(ostream *)out_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

log_ostream::log_ostream(ostream& out, string marker) :
	ostream(&buffer_),
	buffer_(out, marker) {
}